

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * sqlite3SrcListLookup(Parse *pParse,SrcList *pSrc)

{
  int iVar1;
  sqlite3 *db;
  Parse *in_RSI;
  Parse *in_RDI;
  Table *pTab;
  SrcItem *pItem;
  Table *in_stack_ffffffffffffffd8;
  char **ppcVar2;
  
  ppcVar2 = &in_RSI->zErrMsg;
  db = (sqlite3 *)
       sqlite3LocateTableItem(in_RSI,(u32)((ulong)ppcVar2 >> 0x20),(SrcItem *)&DAT_aaaaaaaaaaaaaaaa)
  ;
  if (ppcVar2[2] != (char *)0x0) {
    sqlite3DeleteTable(db,in_stack_ffffffffffffffd8);
  }
  ppcVar2[2] = (char *)db;
  *(ushort *)((long)ppcVar2 + 0x19) = *(ushort *)((long)ppcVar2 + 0x19) & 0xfbff | 0x400;
  if (((db != (sqlite3 *)0x0) &&
      (db->mDbFlags = db->mDbFlags + 1, (*(ushort *)((long)ppcVar2 + 0x19) >> 1 & 1) != 0)) &&
     (iVar1 = sqlite3IndexedByLookup(in_RDI,(SrcItem *)in_RSI), iVar1 != 0)) {
    db = (sqlite3 *)0x0;
  }
  return (Table *)db;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3SrcListLookup(Parse *pParse, SrcList *pSrc){
  SrcItem *pItem = pSrc->a;
  Table *pTab;
  assert( pItem && pSrc->nSrc>=1 );
  pTab = sqlite3LocateTableItem(pParse, 0, pItem);
  if( pItem->pSTab ) sqlite3DeleteTable(pParse->db, pItem->pSTab);
  pItem->pSTab = pTab;
  pItem->fg.notCte = 1;
  if( pTab ){
    pTab->nTabRef++;
    if( pItem->fg.isIndexedBy && sqlite3IndexedByLookup(pParse, pItem) ){
      pTab = 0;
    }
  }
  return pTab;
}